

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbrz.cpp
# Opt level: O2

void (anonymous_namespace)::Scaler5x<(anonymous_namespace)::ColorGradientRGB>::alphaGrad<23u,100u>
               (uint32_t *pixBack,uint32_t pixFront)

{
  uint uVar1;
  
  uVar1 = *pixBack;
  *pixBack = ((uVar1 & 0xff) * 0x4d + (pixFront & 0xff) * 0x17) / 100 +
             (((uVar1 >> 8 & 0xff) * 0x4d + (pixFront >> 8 & 0xff) * 0x17) / 100 & 0xff) * 0x100 +
             (((uVar1 >> 0x10 & 0xff) * 0x4d + (pixFront >> 0x10 & 0xff) * 0x17) / 100) * 0x10000;
  return;
}

Assistant:

static void alphaGrad(uint32_t& pixBack, uint32_t pixFront) { ColorGradient::template alphaGrad<M, N>(pixBack, pixFront); }